

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O0

void Acec_MoveDuplicates(Vec_Wec_t *vLits,Vec_Wec_t *vClasses)

{
  int iVar1;
  int iVar2;
  int i_00;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar3;
  Vec_Int_t *vClasses_00;
  bool bVar4;
  uint local_40;
  int Counter;
  int Entry;
  int This;
  int Prev;
  int k;
  int i;
  Vec_Int_t *vLevel2;
  Vec_Int_t *vLevel1;
  Vec_Wec_t *vClasses_local;
  Vec_Wec_t *vLits_local;
  
  local_40 = 0;
  for (Prev = 0; iVar1 = Vec_WecSize(vLits), Prev < iVar1; Prev = Prev + 1) {
    p = Vec_WecEntry(vLits,Prev);
    iVar1 = Vec_WecSize(vLits);
    if (Prev == iVar1 + -1) break;
    p_00 = Vec_WecEntry(vClasses,Prev);
    iVar1 = Vec_IntSize(p);
    iVar2 = Vec_IntSize(p_00);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_IntSize(vLevel1) == Vec_IntSize(vLevel2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/acec/acecCore.c"
                    ,0x148,"void Acec_MoveDuplicates(Vec_Wec_t *, Vec_Wec_t *)");
    }
    Entry = -1;
    for (This = 0; iVar1 = Vec_IntSize(p_00), This < iVar1; This = This + 1) {
      iVar1 = Vec_IntEntry(p_00,This);
      bVar4 = Entry == iVar1;
      Entry = iVar1;
      if (bVar4) {
        Entry = -1;
        iVar2 = Vec_IntEntry(p,This);
        Vec_IntDrop(p,This);
        i_00 = This + -1;
        Vec_IntDrop(p_00,This);
        Vec_IntDrop(p,i_00);
        This = This + -2;
        Vec_IntDrop(p_00,i_00);
        pVVar3 = Vec_WecEntry(vLits,Prev + 1);
        vClasses_00 = Vec_WecEntry(vClasses,Prev + 1);
        Vec_IntInsertOrder(pVVar3,vClasses_00,iVar2,iVar1);
        iVar1 = Vec_IntSize(p);
        iVar2 = Vec_IntSize(p_00);
        if (iVar1 != iVar2) {
          __assert_fail("Vec_IntSize(vLevel1) == Vec_IntSize(vLevel2)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/acec/acecCore.c"
                        ,0x15c,"void Acec_MoveDuplicates(Vec_Wec_t *, Vec_Wec_t *)");
        }
        pVVar3 = Vec_WecEntry(vLits,Prev + 1);
        iVar1 = Vec_IntSize(pVVar3);
        pVVar3 = Vec_WecEntry(vClasses,Prev + 1);
        iVar2 = Vec_IntSize(pVVar3);
        if (iVar1 != iVar2) {
          __assert_fail("Vec_IntSize(Vec_WecEntry(vLits, i+1)) == Vec_IntSize(Vec_WecEntry(vClasses, i+1))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/acec/acecCore.c"
                        ,0x15d,"void Acec_MoveDuplicates(Vec_Wec_t *, Vec_Wec_t *)");
        }
        local_40 = local_40 + 1;
      }
    }
  }
  printf("Moved %d pairs of PPs to normalize the matrix.\n",(ulong)local_40);
  return;
}

Assistant:

void Acec_MoveDuplicates( Vec_Wec_t * vLits, Vec_Wec_t * vClasses )
{
    Vec_Int_t * vLevel1, * vLevel2; 
    int i, k, Prev, This, Entry, Counter = 0;
    Vec_WecForEachLevel( vLits, vLevel1, i )
    {
        if ( i == Vec_WecSize(vLits) - 1 )
            break;
        vLevel2 = Vec_WecEntry(vClasses, i);
        assert( Vec_IntSize(vLevel1) == Vec_IntSize(vLevel2) );
        Prev = -1;
        Vec_IntForEachEntry( vLevel2, This, k )
        {
            if ( Prev != This )
            {
                Prev = This;
                continue;
            }
            Prev = -1;
            Entry = Vec_IntEntry( vLevel1, k );

            Vec_IntDrop( vLevel1, k );
            Vec_IntDrop( vLevel2, k-- );

            Vec_IntDrop( vLevel1, k );
            Vec_IntDrop( vLevel2, k-- );

            Vec_IntInsertOrder( Vec_WecEntry(vLits, i+1), Vec_WecEntry(vClasses, i+1), Entry, This );

            assert( Vec_IntSize(vLevel1)                  == Vec_IntSize(vLevel2) );
            assert( Vec_IntSize(Vec_WecEntry(vLits, i+1)) == Vec_IntSize(Vec_WecEntry(vClasses, i+1)) );
            Counter++;
        }
    }
    printf( "Moved %d pairs of PPs to normalize the matrix.\n", Counter );
}